

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

int __thiscall amrex::ParmParse::remove(ParmParse *this,char *__filename)

{
  bool bVar1;
  _List_node_base *p_Var2;
  iterator __position;
  int iVar3;
  allocator local_79;
  char *local_78;
  string local_70;
  string local_50;
  
  p_Var2 = (_List_node_base *)this->m_table;
  __position._M_node =
       (((_List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
        &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
  iVar3 = 0;
  local_78 = __filename;
  while (__position._M_node != p_Var2) {
    std::__cxx11::string::string((string *)&local_70,local_78,&local_79);
    prefixedName(&local_50,this,&local_70);
    bVar1 = anon_unknown_12::ppfound(&local_50,(PP_entry *)(__position._M_node + 1),false);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar1) {
      __position = std::__cxx11::
                   list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::
                   erase(this->m_table,__position._M_node);
      iVar3 = iVar3 + 1;
    }
    else {
      __position._M_node = (__position._M_node)->_M_next;
    }
    p_Var2 = (_List_node_base *)this->m_table;
  }
  return iVar3;
}

Assistant:

int
ParmParse::remove (const char* name)
{
    int r = 0;
    for (auto it = m_table.begin(); it != m_table.end(); ) {
        if (ppfound(prefixedName(name), *it, false)) {
            it = m_table.erase(it);
            ++r;
        } else {
            ++it;
        }
    }
    return r;
}